

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  bool bVar6;
  int32_t iVar7;
  long lVar8;
  uint8_t *puVar9;
  int32_t length_00;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int32_t local_4c;
  
  uVar3 = this->strings->count;
  iVar13 = 0;
  lVar8 = 0;
  if (this->all != '\0') {
    lVar8 = (long)(int)uVar3 * 2;
  }
  puVar5 = this->spanLengths;
  length_00 = length;
  do {
    iVar7 = UnicodeSet::spanUTF8
                      (this->pSpanNotSet,(char *)(s + iVar13),length_00,USET_SPAN_NOT_CONTAINED);
    length_00 = length_00 - iVar7;
    if (length_00 == 0) {
      return length;
    }
    iVar13 = iVar7 + iVar13;
    iVar7 = spanOneUTF8(&this->spanSet,s + iVar13,length_00);
    if (iVar7 < 1) {
      if (0 < (int)uVar3) {
        puVar9 = this->utf8;
        uVar10 = 0;
        do {
          iVar4 = this->utf8Lengths[uVar10];
          if ((((long)iVar4 != 0) && (iVar4 <= length_00)) && (puVar5[uVar10 + lVar8] != 0xff)) {
            lVar11 = 0;
            iVar12 = iVar4;
            do {
              uVar2 = (s + iVar13)[lVar11];
              puVar1 = puVar9 + lVar11;
              if (uVar2 != *puVar1) break;
              lVar11 = lVar11 + 1;
              bVar6 = 1 < iVar12;
              iVar12 = iVar12 + -1;
            } while (bVar6);
            if (uVar2 == *puVar1) goto LAB_002eeea3;
          }
          puVar9 = puVar9 + iVar4;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar3);
      }
      iVar13 = iVar13 - iVar7;
      length_00 = length_00 + iVar7;
      bVar6 = true;
    }
    else {
LAB_002eeea3:
      bVar6 = false;
      local_4c = iVar13;
    }
    if (!bVar6) {
      return local_4c;
    }
    if (length_00 == 0) {
      return length;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->spanUTF8((const char *)s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneUTF8(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=rest && matches8(s+pos, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}